

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::Maybe<kj::Promise<void>_>::Maybe
          (Maybe<kj::Promise<void>_> *this,Maybe<kj::Promise<void>_> *other)

{
  bool bVar1;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = bVar1;
  if (bVar1 == true) {
    (this->ptr).field_1 = (other->ptr).field_1;
    (other->ptr).field_1 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
  }
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }